

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

Float __thiscall
pbrt::ImageInfiniteLight::PDF_Li
          (ImageInfiniteLight *this,LightSampleContext ctx,Vector3f w,LightSamplingMode mode)

{
  Float FVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Vector3<float> d;
  Point2f uv;
  Tuple2<pbrt::Point2,_float> local_28;
  Tuple3<pbrt::Vector3,_float> local_20;
  undefined1 extraout_var [56];
  
  local_20.z = w.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._8_56_ = w._8_56_;
  auVar2._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_20._0_8_ = vmovlps_avx(auVar2._0_16_);
  d = Transform::ApplyInverse<float>
                (&(this->super_LightBase).renderFromLight,(Vector3<float> *)&local_20);
  auVar3._0_8_ = EqualAreaSphereToSquare((Vector3f)d.super_Tuple3<pbrt::Vector3,_float>);
  auVar3._8_56_ = extraout_var;
  local_28 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3._0_16_);
  FVar1 = PiecewiseConstant2D::PDF(&this->distribution + (mode == WithMIS),(Point2f *)&local_28);
  return FVar1 / 12.566371;
}

Assistant:

Float ImageInfiniteLight::PDF_Li(LightSampleContext ctx, Vector3f w,
                                 LightSamplingMode mode) const {
    Vector3f wl = renderFromLight.ApplyInverse(w);
    Point2f uv = EqualAreaSphereToSquare(wl);
    Float pdf = (mode == LightSamplingMode::WithMIS) ? compensatedDistribution.PDF(uv)
                                                     : distribution.PDF(uv);
    return pdf / (4 * Pi);
}